

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::CumulativeReporterBase::sectionStarting
          (CumulativeReporterBase *this,SectionInfo *sectionInfo)

{
  pointer *pppSVar1;
  pointer pcVar2;
  pointer ppSVar3;
  SectionNode *pSVar4;
  iterator __position;
  bool bVar5;
  long lVar6;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  __it;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  _Var7;
  long lVar8;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> uVar9;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> newNode;
  SectionNode *node;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> local_d0;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *local_c8;
  SectionStats local_c0;
  SectionNode *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char *local_40;
  size_t sStack_38;
  
  pcVar2 = (sectionInfo->name)._M_dataplus._M_p;
  local_60 = (SectionNode *)&local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + (sectionInfo->name)._M_string_length);
  local_40 = (sectionInfo->lineInfo).file;
  sStack_38 = (sectionInfo->lineInfo).line;
  local_c0.sectionInfo.name._M_dataplus._M_p = (pointer)&local_c0.sectionInfo.name.field_2;
  if (local_60 == (SectionNode *)&local_50) {
    local_c0.sectionInfo.name.field_2._8_8_ = local_50._8_8_;
  }
  else {
    local_c0.sectionInfo.name._M_dataplus._M_p = (pointer)local_60;
  }
  local_c0.sectionInfo.name.field_2._M_allocated_capacity = local_50._M_allocated_capacity;
  local_c0.sectionInfo.name._M_string_length = local_58;
  local_c0.sectionInfo.lineInfo.file = (sectionInfo->lineInfo).file;
  local_c0.sectionInfo.lineInfo.line = (sectionInfo->lineInfo).line;
  local_c0.durationInSeconds._0_1_ = 0;
  local_c0._81_8_ = 0;
  local_c0.assertions.failedButOk = 0;
  local_c0.assertions.skipped._0_1_ = 0;
  local_c0.assertions.skipped._1_7_ = 0;
  local_c0.assertions.passed = 0;
  local_c0.assertions.failed = 0;
  ppSVar3 = (this->m_sectionStack).
            super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_sectionStack).
      super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start == ppSVar3) {
    uVar9.m_ptr = (this->m_rootSection).m_ptr;
    pSVar4 = uVar9.m_ptr;
    if (uVar9.m_ptr == (SectionNode *)0x0) {
      Detail::make_unique<Catch::CumulativeReporterBase::SectionNode,Catch::SectionStats&>
                ((Detail *)&local_d0,&local_c0);
      uVar9.m_ptr = local_d0.m_ptr;
      local_d0.m_ptr = (SectionNode *)0x0;
      Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::reset
                (&this->m_rootSection,uVar9.m_ptr);
      Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::~unique_ptr(&local_d0);
      uVar9.m_ptr = (this->m_rootSection).m_ptr;
      pSVar4 = uVar9.m_ptr;
    }
    goto LAB_001625f5;
  }
  pSVar4 = ppSVar3[-1];
  __it._M_current =
       (pSVar4->childSections).
       super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = (pSVar4->childSections).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)local_c8 - (long)__it._M_current;
  if (0 < lVar8 >> 5) {
    lVar6 = (lVar8 >> 5) + 1;
    do {
      bVar5 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                        ((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)sectionInfo,__it
                        );
      _Var7._M_current = __it._M_current;
      if (bVar5) goto LAB_001625a8;
      bVar5 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                        ((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)sectionInfo,
                         __it._M_current + 1);
      _Var7._M_current = __it._M_current + 1;
      if (bVar5) goto LAB_001625a8;
      bVar5 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                        ((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)sectionInfo,
                         __it._M_current + 2);
      _Var7._M_current = __it._M_current + 2;
      if (bVar5) goto LAB_001625a8;
      bVar5 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                        ((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)sectionInfo,
                         __it._M_current + 3);
      _Var7._M_current = __it._M_current + 3;
      if (bVar5) goto LAB_001625a8;
      __it._M_current = __it._M_current + 4;
      lVar6 = lVar6 + -1;
      lVar8 = lVar8 + -0x20;
    } while (1 < lVar6);
  }
  lVar8 = lVar8 >> 3;
  if (lVar8 == 1) {
LAB_00162592:
    bVar5 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                      ((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)sectionInfo,__it);
    _Var7._M_current = local_c8;
    if (bVar5) {
      _Var7._M_current = __it._M_current;
    }
  }
  else if (lVar8 == 2) {
LAB_00162519:
    bVar5 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                      ((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)sectionInfo,__it);
    _Var7._M_current = __it._M_current;
    if (!bVar5) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00162592;
    }
  }
  else {
    _Var7._M_current = local_c8;
    if ((lVar8 == 3) &&
       (bVar5 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::
                operator()((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)sectionInfo,
                           __it), _Var7._M_current = __it._M_current, !bVar5)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00162519;
    }
  }
LAB_001625a8:
  if (_Var7._M_current ==
      (pSVar4->childSections).
      super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Detail::make_unique<Catch::CumulativeReporterBase::SectionNode,Catch::SectionStats&>
              ((Detail *)&local_d0,&local_c0);
    uVar9.m_ptr = local_d0.m_ptr;
    local_60 = local_d0.m_ptr;
    std::
    vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>>
    ::emplace_back<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>
              ((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>>
                *)&pSVar4->childSections,&local_d0);
    Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::~unique_ptr(&local_d0);
    pSVar4 = local_60;
  }
  else {
    uVar9.m_ptr = (_Var7._M_current)->m_ptr;
    pSVar4 = uVar9.m_ptr;
  }
LAB_001625f5:
  local_60 = pSVar4;
  this->m_deepestSection = uVar9.m_ptr;
  __position._M_current =
       (this->m_sectionStack).
       super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_sectionStack).
      super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Catch::CumulativeReporterBase::SectionNode*,std::allocator<Catch::CumulativeReporterBase::SectionNode*>>
    ::_M_realloc_insert<Catch::CumulativeReporterBase::SectionNode*const&>
              ((vector<Catch::CumulativeReporterBase::SectionNode*,std::allocator<Catch::CumulativeReporterBase::SectionNode*>>
                *)&this->m_sectionStack,__position,&local_60);
  }
  else {
    *__position._M_current = uVar9.m_ptr;
    pppSVar1 = &(this->m_sectionStack).
                super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.sectionInfo.name._M_dataplus._M_p != &local_c0.sectionInfo.name.field_2) {
    operator_delete(local_c0.sectionInfo.name._M_dataplus._M_p,
                    local_c0.sectionInfo.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
    CumulativeReporterBase::sectionStarting( SectionInfo const& sectionInfo ) {
        // We need a copy, because SectionStats expect to take ownership
        SectionStats incompleteStats( SectionInfo(sectionInfo), Counts(), 0, false );
        SectionNode* node;
        if ( m_sectionStack.empty() ) {
            if ( !m_rootSection ) {
                m_rootSection =
                    Detail::make_unique<SectionNode>( incompleteStats );
            }
            node = m_rootSection.get();
        } else {
            SectionNode& parentNode = *m_sectionStack.back();
            auto it = std::find_if( parentNode.childSections.begin(),
                                    parentNode.childSections.end(),
                                    BySectionInfo( sectionInfo ) );
            if ( it == parentNode.childSections.end() ) {
                auto newNode =
                    Detail::make_unique<SectionNode>( incompleteStats );
                node = newNode.get();
                parentNode.childSections.push_back( CATCH_MOVE( newNode ) );
            } else {
                node = it->get();
            }
        }

        m_deepestSection = node;
        m_sectionStack.push_back( node );
    }